

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O2

void gl4cts::MultiBind::checkVertexAttribBinding(Context *context,GLuint index,GLint expected_value)

{
  ostringstream *this;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  GLint binding;
  undefined1 local_1a8 [384];
  
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  binding = -1;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xbe0))(index,0x889f,&binding);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"GetVertexAttribiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x5bf);
  if (binding == expected_value) {
    return;
  }
  local_1a8._0_8_ = context->m_testCtx->m_log;
  this = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"Invalid binding: ");
  std::ostream::operator<<(this,binding);
  std::operator<<((ostream *)this,", expected: ");
  std::ostream::operator<<(this,expected_value);
  std::operator<<((ostream *)this,". Target: Vertex attribute");
  std::operator<<((ostream *)this," at index: ");
  std::ostream::_M_insert<unsigned_long>((ulong)this);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid binding",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x5c6);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void checkVertexAttribBinding(deqp::Context& context, GLuint index, GLint expected_value)
{
	const Functions& gl = context.getRenderContext().getFunctions();

	GLint binding = -1;

	gl.getVertexAttribiv(index, GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING, &binding);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetVertexAttribiv");

	if (binding != expected_value)
	{
		context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid binding: " << binding
										  << ", expected: " << expected_value << ". Target: Vertex attribute"
										  << " at index: " << index << tcu::TestLog::EndMessage;
		TCU_FAIL("Invalid binding");
	}
}